

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *format,char *format_max,float power)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *text_end;
  float local_58;
  float local_54;
  float *local_50;
  float local_48;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    local_48 = v_min;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2,0.0);
    local_54 = (float)(~-(uint)(v_max <= local_48) & (uint)local_48 |
                      -(uint)(v_max <= local_48) & 0xff7fffff);
    fVar1 = *v_current_max;
    local_58 = fVar1;
    if ((local_48 < v_max) && (local_58 = v_max, fVar1 <= v_max)) {
      local_58 = fVar1;
    }
    local_50 = v_current_max;
    bVar4 = DragScalar("##min",4,v_current_min,v_speed,&local_54,&local_58,format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    local_54 = *v_current_min;
    if (v_max <= local_48) {
      v_max = 3.4028235e+38;
    }
    else {
      local_54 = (float)(~-(uint)(local_54 <= local_48) & (uint)local_54 |
                        (uint)local_48 & -(uint)(local_54 <= local_48));
    }
    if (format_max != (char *)0x0) {
      format = format_max;
    }
    local_58 = v_max;
    bVar5 = DragScalar("##max",4,local_50,v_speed,&local_54,&local_58,format,power);
    bVar4 = bVar4 || bVar5;
    PopItemWidth();
    SameLine(0.0,(pIVar3->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
    PopID();
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2);

    bool value_changed = DragFloat("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragFloat("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? FLT_MAX : v_max, format_max ? format_max : format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();
    return value_changed;
}